

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O3

store * store_at(chunk_conflict2 *c,loc_conflict grid)

{
  wchar_t wVar1;
  _Bool _Var2;
  wchar_t wVar3;
  long lVar4;
  store *psVar5;
  
  _Var2 = square_isshop((chunk_conflict *)c,(loc)grid);
  if ((_Var2) && (lVar4 = (long)world->num_towns, 0 < lVar4)) {
    psVar5 = (store *)&world->towns->stores;
    do {
      if (*(int *)&psVar5[-1].buy == world->levels[player->place].index) {
        do {
          psVar5 = psVar5->next;
          if (psVar5 == (store *)0x0) {
            return (store *)0x0;
          }
          wVar1 = psVar5->sidx;
          wVar3 = square_shopnum(cave,(loc)grid);
        } while (wVar1 != wVar3);
        return psVar5;
      }
      psVar5 = (store *)&psVar5->town;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  return (store *)0x0;
}

Assistant:

struct store *store_at(struct chunk *c, struct loc grid)
{
	struct store *s = NULL;

	if (square_isshop(c, grid)) {
		struct level *lev = &world->levels[player->place];
		struct town *town = NULL;
		int i;
		for (i = 0; i < world->num_towns; i++) {
			town = &world->towns[i];
			if (town->index == lev->index) break;
		}
		if (i < world->num_towns) {
			for (s = town->stores; s; s = s->next) {
				if ((int) s->sidx == square_shopnum(cave, grid)) break;
			}
		}
	}

	return s;
}